

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O2

void __thiscall
vkt::wsi::anon_unknown_0::InstanceHelper::InstanceHelper
          (InstanceHelper *this,Context *context,Type wsiType,VkAllocationCallbacks *pAllocator)

{
  PlatformInterface *vkPlatform;
  VkInstance_s *pVVar1;
  DestroyInstanceFunc p_Var2;
  VkAllocationCallbacks *pVVar3;
  bool bVar4;
  char *__s;
  NotSupportedError *this_00;
  pointer name_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  Maybe<unsigned_int> local_a8;
  RequiredExtension local_98;
  Maybe<unsigned_int> local_58;
  RefBase<vk::VkInstance_s_*> local_48;
  
  ::vk::enumerateInstanceExtensionProperties
            (&this->supportedExtensions,context->m_platformInterface,(char *)0x0);
  vkPlatform = context->m_platformInterface;
  extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"VK_KHR_surface",(allocator<char> *)&local_a8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&extensions,
             &local_98.name);
  std::__cxx11::string::~string((string *)&local_98);
  __s = ::vk::wsi::getExtensionName(wsiType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,__s,(allocator<char> *)&local_a8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&extensions,
             &local_98.name);
  std::__cxx11::string::~string((string *)&local_98);
  name_ = extensions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (name_ == extensions.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      local_98.name._M_dataplus._M_p = (pointer)0x0;
      local_98.name._M_string_length = 0;
      local_98.name.field_2._M_allocated_capacity = 0;
      ::vk::createDefaultInstance
                ((Move<vk::VkInstance_s_*> *)&local_48,vkPlatform,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_98,&extensions,pAllocator);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&extensions);
      pVVar3 = local_48.m_data.deleter.m_allocator;
      p_Var2 = local_48.m_data.deleter.m_destroyInstance;
      pVVar1 = local_48.m_data.object;
      local_98.name.field_2._M_allocated_capacity = (size_type)local_48.m_data.deleter.m_allocator;
      local_48.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      local_98.name._M_dataplus._M_p = (pointer)local_48.m_data.object;
      local_98.name._M_string_length = (size_type)local_48.m_data.deleter.m_destroyInstance;
      local_48.m_data.object = (VkInstance_s *)0x0;
      local_48.m_data.deleter.m_destroyInstance = (DestroyInstanceFunc)0x0;
      (this->instance).super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator = pVVar3;
      (this->instance).super_RefBase<vk::VkInstance_s_*>.m_data.object = pVVar1;
      (this->instance).super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance = p_Var2;
      ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase(&local_48);
      ::vk::InstanceDriver::InstanceDriver
                (&this->vki,context->m_platformInterface,
                 (this->instance).super_RefBase<vk::VkInstance_s_*>.m_data.object);
      return;
    }
    local_a8.m_ptr = (uint *)0x0;
    local_58.m_ptr = (uint *)0x0;
    ::vk::RequiredExtension::RequiredExtension(&local_98,name_,&local_a8,&local_58);
    bVar4 = ::vk::isExtensionSupported(&this->supportedExtensions,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if (!bVar4) break;
    name_ = name_ + 1;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::operator+(&local_98.name,name_," is not supported");
  tcu::NotSupportedError::NotSupportedError
            (this_00,local_98.name._M_dataplus._M_p,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
             ,0x55);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

InstanceHelper (Context& context, Type wsiType, const VkAllocationCallbacks* pAllocator = DE_NULL)
		: supportedExtensions	(enumerateInstanceExtensionProperties(context.getPlatformInterface(),
																	  DE_NULL))
		, instance				(createInstanceWithWsi(context.getPlatformInterface(),
													   supportedExtensions,
													   wsiType,
													   pAllocator))
		, vki					(context.getPlatformInterface(), *instance)
	{}